

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O1

void __thiscall
llm_build_chameleon::llm_build_chameleon
          (llm_build_chameleon *this,llama_model *model,llm_graph_params *params,ggml_cgraph *gf)

{
  uint uVar1;
  int iVar2;
  llama_hparams *plVar3;
  int64_t iVar4;
  ggml_context *pgVar5;
  pointer plVar6;
  ggml_tensor *pgVar7;
  llm_graph_input_attn_kv_unified *inp;
  ggml_tensor *pgVar8;
  ggml_tensor *pgVar9;
  long lVar10;
  long lVar11;
  ggml_tensor *pgVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  ggml_tensor *cur;
  char *pcVar15;
  ulong uVar16;
  int il;
  long lVar17;
  float __x;
  float fVar18;
  ggml_tensor *inpSA;
  undefined8 in_stack_ffffffffffffff28;
  undefined4 uVar19;
  long local_78;
  ggml_tensor *local_70;
  ggml_tensor *local_68;
  
  llm_graph_context::llm_graph_context(&this->super_llm_graph_context,params);
  plVar3 = (this->super_llm_graph_context).hparams;
  uVar1 = plVar3->n_embd_head_v;
  uVar16 = (ulong)uVar1;
  if (uVar1 == plVar3->n_embd_head_k) {
    if (uVar1 == plVar3->n_rot) {
      local_70 = llm_graph_context::build_inp_embd(&this->super_llm_graph_context,model->tok_embd);
      pgVar7 = llm_graph_context::build_inp_pos(&this->super_llm_graph_context);
      inp = llm_graph_context::build_attn_inp_kv_unified(&this->super_llm_graph_context);
      if (0 < (this->super_llm_graph_context).n_layer) {
        __x = (float)uVar16;
        local_78 = 0;
        lVar17 = 0;
        do {
          uVar19 = (undefined4)((ulong)in_stack_ffffffffffffff28 >> 0x20);
          il = (int)lVar17;
          pgVar8 = local_70;
          if (((this->super_llm_graph_context).hparams)->swin_norm == false) {
            pgVar8 = llm_graph_context::build_norm
                               (&this->super_llm_graph_context,local_70,
                                *(ggml_tensor **)
                                 ((long)&((model->layers).
                                          super__Vector_base<llama_layer,_std::allocator<llama_layer>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->attn_norm +
                                 local_78),(ggml_tensor *)0x0,LLM_NORM_RMS,il);
            llm_graph_context::cb(&this->super_llm_graph_context,pgVar8,"attn_norm",il);
          }
          local_68 = llm_graph_context::build_lora_mm
                               (&this->super_llm_graph_context,
                                *(ggml_tensor **)
                                 ((long)&((model->layers).
                                          super__Vector_base<llama_layer,_std::allocator<llama_layer>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->wq + local_78)
                                ,pgVar8);
          llm_graph_context::cb(&this->super_llm_graph_context,local_68,"Qcur",il);
          pgVar9 = llm_graph_context::build_lora_mm
                             (&this->super_llm_graph_context,
                              *(ggml_tensor **)
                               ((long)&((model->layers).
                                        super__Vector_base<llama_layer,_std::allocator<llama_layer>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->wk + local_78),
                              pgVar8);
          llm_graph_context::cb(&this->super_llm_graph_context,pgVar9,"Kcur",il);
          pgVar8 = llm_graph_context::build_lora_mm
                             (&this->super_llm_graph_context,
                              *(ggml_tensor **)
                               ((long)&((model->layers).
                                        super__Vector_base<llama_layer,_std::allocator<llama_layer>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->wv + local_78),
                              pgVar8);
          llm_graph_context::cb(&this->super_llm_graph_context,pgVar8,"Vcur",il);
          if (*(long *)((long)&((model->layers).
                                super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                _M_impl.super__Vector_impl_data._M_start)->attn_q_norm + local_78)
              != 0) {
            iVar4 = (this->super_llm_graph_context).n_head;
            pgVar5 = (this->super_llm_graph_context).ctx0;
            iVar2 = (this->super_llm_graph_context).n_tokens;
            lVar10 = ggml_element_size(local_68);
            lVar11 = ggml_element_size(local_68);
            lVar11 = lVar11 * uVar16 * (this->super_llm_graph_context).n_head;
            pgVar12 = (ggml_tensor *)
                      ggml_view_3d(pgVar5,local_68,uVar16,iVar4,(long)iVar2,lVar10 * uVar16,lVar11,0
                                  );
            uVar19 = (undefined4)((ulong)lVar11 >> 0x20);
            llm_graph_context::cb(&this->super_llm_graph_context,pgVar12,"Qcur",il);
            plVar6 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            local_68 = llm_graph_context::build_norm
                                 (&this->super_llm_graph_context,pgVar12,
                                  *(ggml_tensor **)((long)&plVar6->attn_q_norm + local_78),
                                  *(ggml_tensor **)((long)&plVar6->attn_q_norm_b + local_78),
                                  LLM_NORM,il);
            llm_graph_context::cb(&this->super_llm_graph_context,local_68,"Qcur",il);
          }
          if (*(long *)((long)&((model->layers).
                                super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                _M_impl.super__Vector_impl_data._M_start)->attn_k_norm + local_78)
              != 0) {
            iVar4 = (this->super_llm_graph_context).n_head_kv;
            pgVar5 = (this->super_llm_graph_context).ctx0;
            iVar2 = (this->super_llm_graph_context).n_tokens;
            lVar10 = ggml_element_size(pgVar9);
            lVar11 = ggml_element_size(pgVar9);
            lVar11 = lVar11 * uVar16 * (this->super_llm_graph_context).n_head_kv;
            pgVar9 = (ggml_tensor *)
                     ggml_view_3d(pgVar5,pgVar9,uVar16,iVar4,(long)iVar2,lVar10 * uVar16,lVar11,0);
            uVar19 = (undefined4)((ulong)lVar11 >> 0x20);
            llm_graph_context::cb(&this->super_llm_graph_context,pgVar9,"Kcur",il);
            plVar6 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            pgVar9 = llm_graph_context::build_norm
                               (&this->super_llm_graph_context,pgVar9,
                                *(ggml_tensor **)((long)&plVar6->attn_k_norm + local_78),
                                *(ggml_tensor **)((long)&plVar6->attn_k_norm_b + local_78),LLM_NORM,
                                il);
            llm_graph_context::cb(&this->super_llm_graph_context,pgVar9,"Kcur",il);
          }
          uVar13 = ggml_reshape_3d((this->super_llm_graph_context).ctx0,local_68,uVar16,
                                   (this->super_llm_graph_context).n_head,
                                   (long)(this->super_llm_graph_context).n_tokens);
          uVar14 = ggml_reshape_3d((this->super_llm_graph_context).ctx0,pgVar9,uVar16,
                                   (this->super_llm_graph_context).n_head_kv,
                                   (long)(this->super_llm_graph_context).n_tokens);
          pgVar9 = (ggml_tensor *)
                   ggml_reshape_3d((this->super_llm_graph_context).ctx0,pgVar8,uVar16,
                                   (this->super_llm_graph_context).n_head_kv,
                                   (long)(this->super_llm_graph_context).n_tokens);
          pgVar12 = (ggml_tensor *)
                    ggml_rope_ext((this->super_llm_graph_context).freq_base,
                                  (this->super_llm_graph_context).freq_scale,
                                  (this->super_llm_graph_context).ext_factor,
                                  (this->super_llm_graph_context).attn_factor,
                                  (this->super_llm_graph_context).beta_fast,
                                  (this->super_llm_graph_context).beta_slow,
                                  (this->super_llm_graph_context).ctx0,uVar13,pgVar7,0,
                                  (int)(this->super_llm_graph_context).n_rot,
                                  (this->super_llm_graph_context).rope_type,
                                  CONCAT44(uVar19,(this->super_llm_graph_context).n_ctx_orig));
          cur = (ggml_tensor *)
                ggml_rope_ext((this->super_llm_graph_context).freq_base,
                              (this->super_llm_graph_context).freq_scale,
                              (this->super_llm_graph_context).ext_factor,
                              (this->super_llm_graph_context).attn_factor,
                              (this->super_llm_graph_context).beta_fast,
                              (this->super_llm_graph_context).beta_slow,
                              (this->super_llm_graph_context).ctx0,uVar14,pgVar7,0,
                              (int)(this->super_llm_graph_context).n_rot,
                              (this->super_llm_graph_context).rope_type,
                              (this->super_llm_graph_context).n_ctx_orig);
          llm_graph_context::cb(&this->super_llm_graph_context,pgVar12,"Qcur",il);
          llm_graph_context::cb(&this->super_llm_graph_context,cur,"Kcur",il);
          llm_graph_context::cb(&this->super_llm_graph_context,pgVar9,"Vcur",il);
          pgVar8 = *(ggml_tensor **)
                    ((long)&((model->layers).
                             super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl.
                             super__Vector_impl_data._M_start)->wo + local_78);
          fVar18 = SQRT(__x);
          if (__x < 0.0) {
            fVar18 = sqrtf(__x);
          }
          pgVar8 = llm_graph_context::build_attn
                             (&this->super_llm_graph_context,inp,gf,pgVar8,(ggml_tensor *)0x0,
                              pgVar12,cur,pgVar9,(ggml_tensor *)0x0,(ggml_tensor *)0x0,1.0 / fVar18,
                              il);
          if (((this->super_llm_graph_context).hparams)->swin_norm == true) {
            pgVar8 = llm_graph_context::build_norm
                               (&this->super_llm_graph_context,pgVar8,
                                *(ggml_tensor **)
                                 ((long)&((model->layers).
                                          super__Vector_base<llama_layer,_std::allocator<llama_layer>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->attn_norm +
                                 local_78),(ggml_tensor *)0x0,LLM_NORM_RMS,il);
          }
          if (lVar17 == (this->super_llm_graph_context).n_layer + -1) {
            pgVar9 = llm_graph_context::build_inp_out_ids(&this->super_llm_graph_context);
            pgVar8 = (ggml_tensor *)
                     ggml_get_rows((this->super_llm_graph_context).ctx0,pgVar8,pgVar9);
            local_70 = (ggml_tensor *)
                       ggml_get_rows((this->super_llm_graph_context).ctx0,local_70,pgVar9);
          }
          pgVar9 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar8,local_70);
          llm_graph_context::cb(&this->super_llm_graph_context,pgVar9,"ffn_inp",il);
          if (((this->super_llm_graph_context).hparams)->swin_norm == false) {
            pgVar8 = llm_graph_context::build_norm
                               (&this->super_llm_graph_context,pgVar9,
                                *(ggml_tensor **)
                                 ((long)&((model->layers).
                                          super__Vector_base<llama_layer,_std::allocator<llama_layer>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->ffn_norm +
                                 local_78),(ggml_tensor *)0x0,LLM_NORM_RMS,il);
            llm_graph_context::cb(&this->super_llm_graph_context,pgVar8,"ffn_norm",il);
          }
          plVar6 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          in_stack_ffffffffffffff28 = 0;
          pgVar8 = llm_graph_context::build_ffn
                             (&this->super_llm_graph_context,pgVar8,
                              *(ggml_tensor **)((long)&plVar6->ffn_up + local_78),(ggml_tensor *)0x0
                              ,(ggml_tensor *)0x0,
                              *(ggml_tensor **)((long)&plVar6->ffn_gate + local_78),
                              (ggml_tensor *)0x0,(ggml_tensor *)0x0,
                              *(ggml_tensor **)((long)&plVar6->ffn_down + local_78),
                              (ggml_tensor *)0x0,(ggml_tensor *)0x0,(ggml_tensor *)0x0,LLM_FFN_SILU,
                              LLM_FFN_PAR,il);
          llm_graph_context::cb(&this->super_llm_graph_context,pgVar8,"ffn_out",il);
          if (((this->super_llm_graph_context).hparams)->swin_norm == true) {
            pgVar8 = llm_graph_context::build_norm
                               (&this->super_llm_graph_context,pgVar8,
                                *(ggml_tensor **)
                                 ((long)&((model->layers).
                                          super__Vector_base<llama_layer,_std::allocator<llama_layer>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->ffn_norm +
                                 local_78),(ggml_tensor *)0x0,LLM_NORM_RMS,il);
            llm_graph_context::cb(&this->super_llm_graph_context,pgVar8,"ffn_norm",il);
          }
          pgVar8 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar8,pgVar9);
          llm_graph_context::cb(&this->super_llm_graph_context,pgVar8,"ffn_out",il);
          local_70 = llm_graph_context::build_cvec(&this->super_llm_graph_context,pgVar8,il);
          llm_graph_context::cb(&this->super_llm_graph_context,local_70,"l_out",il);
          lVar17 = lVar17 + 1;
          local_78 = local_78 + 0x4f0;
        } while (lVar17 < (this->super_llm_graph_context).n_layer);
      }
      pgVar7 = llm_graph_context::build_norm
                         (&this->super_llm_graph_context,local_70,model->output_norm,
                          (ggml_tensor *)0x0,LLM_NORM_RMS,-1);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar7,"result_norm",-1);
      ((this->super_llm_graph_context).res._M_t.
       super___uniq_ptr_impl<llm_graph_result,_std::default_delete<llm_graph_result>_>._M_t.
       super__Tuple_impl<0UL,_llm_graph_result_*,_std::default_delete<llm_graph_result>_>.
       super__Head_base<0UL,_llm_graph_result_*,_false>._M_head_impl)->t_embd = pgVar7;
      pgVar7 = llm_graph_context::build_lora_mm(&this->super_llm_graph_context,model->output,pgVar7)
      ;
      llm_graph_context::cb
                (&this->super_llm_graph_context,pgVar7,"result_output_with_img_logits",-1);
      uVar13 = ggml_new_tensor_1d((this->super_llm_graph_context).ctx0,0,0x2000);
      pgVar8 = (ggml_tensor *)
               ggml_clamp(0xff7fffff,0xff7fffff,(this->super_llm_graph_context).ctx0,uVar13);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar8,"img_logits",-1);
      pgVar5 = (this->super_llm_graph_context).ctx0;
      lVar17 = ggml_element_size(pgVar7);
      pgVar7 = (ggml_tensor *)ggml_set_1d(pgVar5,pgVar7,pgVar8,lVar17 << 2);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar7,"result_output",-1);
      ((this->super_llm_graph_context).res._M_t.
       super___uniq_ptr_impl<llm_graph_result,_std::default_delete<llm_graph_result>_>._M_t.
       super__Tuple_impl<0UL,_llm_graph_result_*,_std::default_delete<llm_graph_result>_>.
       super__Head_base<0UL,_llm_graph_result_*,_false>._M_head_impl)->t_logits = pgVar7;
      ggml_build_forward_expand(gf,pgVar7);
      return;
    }
    pcVar15 = "n_embd_head == hparams.n_rot";
    uVar13 = 0x2f5f;
  }
  else {
    pcVar15 = "n_embd_head == hparams.n_embd_head_k";
    uVar13 = 0x2f5e;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
             ,uVar13,"GGML_ASSERT(%s) failed",pcVar15);
}

Assistant:

llm_build_chameleon(const llama_model & model, const llm_graph_params & params, ggml_cgraph * gf) : llm_graph_context(params) {
        const int64_t n_embd_head = hparams.n_embd_head_v;

        GGML_ASSERT(n_embd_head == hparams.n_embd_head_k);
        GGML_ASSERT(n_embd_head == hparams.n_rot);

        ggml_tensor * cur;
        ggml_tensor * inpL;

        inpL = build_inp_embd(model.tok_embd);

        // inp_pos - contains the positions
        ggml_tensor * inp_pos = build_inp_pos();

        auto * inp_attn = build_attn_inp_kv_unified();

        for (int il = 0; il < n_layer; ++il) {
            ggml_tensor * inpSA = inpL;

            // norm
            if (hparams.swin_norm) {
                cur = inpL;
            } else {
                cur = build_norm(inpL,
                        model.layers[il].attn_norm, NULL,
                        LLM_NORM_RMS, il);
                cb(cur, "attn_norm", il);
            }

            // self-attention
            {
                // compute Q and K and RoPE them
                ggml_tensor * Qcur = build_lora_mm(model.layers[il].wq, cur);
                cb(Qcur, "Qcur", il);

                ggml_tensor * Kcur = build_lora_mm(model.layers[il].wk, cur);
                cb(Kcur, "Kcur", il);

                ggml_tensor * Vcur = build_lora_mm(model.layers[il].wv, cur);
                cb(Vcur, "Vcur", il);

                if (model.layers[il].attn_q_norm) {
                    Qcur = ggml_view_3d(ctx0, Qcur, n_embd_head, n_head, n_tokens,
                            ggml_element_size(Qcur) * n_embd_head,
                            ggml_element_size(Qcur) * n_embd_head * n_head,
                            0);
                    cb(Qcur, "Qcur", il);

                    Qcur = build_norm(Qcur,
                            model.layers[il].attn_q_norm,
                            model.layers[il].attn_q_norm_b,
                            LLM_NORM, il);
                    cb(Qcur, "Qcur", il);
                }

                if (model.layers[il].attn_k_norm) {
                    Kcur = ggml_view_3d(ctx0, Kcur, n_embd_head, n_head_kv, n_tokens,
                            ggml_element_size(Kcur) * n_embd_head,
                            ggml_element_size(Kcur) * n_embd_head * n_head_kv,
                            0);
                    cb(Kcur, "Kcur", il);

                    Kcur = build_norm(Kcur,
                            model.layers[il].attn_k_norm,
                            model.layers[il].attn_k_norm_b,
                            LLM_NORM, il);
                    cb(Kcur, "Kcur", il);
                }

                Qcur = ggml_reshape_3d(ctx0, Qcur, n_embd_head, n_head,    n_tokens);
                Kcur = ggml_reshape_3d(ctx0, Kcur, n_embd_head, n_head_kv, n_tokens);
                Vcur = ggml_reshape_3d(ctx0, Vcur, n_embd_head, n_head_kv, n_tokens);

                Qcur = ggml_rope_ext(
                        ctx0, Qcur, inp_pos, nullptr,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );

                Kcur = ggml_rope_ext(
                        ctx0, Kcur, inp_pos, nullptr,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );

                cb(Qcur, "Qcur", il);
                cb(Kcur, "Kcur", il);
                cb(Vcur, "Vcur", il);

                cur = build_attn(inp_attn, gf,
                        model.layers[il].wo, nullptr,
                        Qcur, Kcur, Vcur, nullptr, nullptr, 1.0f/sqrtf(float(n_embd_head)), il);

                if (hparams.swin_norm) {
                    cur = build_norm(cur,
                            model.layers[il].attn_norm, NULL,
                            LLM_NORM_RMS, il);
                }
            }

            if (il == n_layer - 1) {
                // skip computing output for unused tokens
                ggml_tensor * inp_out_ids = build_inp_out_ids();
                cur   = ggml_get_rows(ctx0,   cur, inp_out_ids);
                inpSA = ggml_get_rows(ctx0, inpSA, inp_out_ids);
            }

            ggml_tensor * ffn_inp = ggml_add(ctx0, cur, inpSA);
            cb(ffn_inp, "ffn_inp", il);

            // feed-forward network
            if (!hparams.swin_norm) {
                cur = build_norm(ffn_inp,
                        model.layers[il].ffn_norm, NULL,
                        LLM_NORM_RMS, il);
                cb(cur, "ffn_norm", il);
            }

            cur = build_ffn(cur,
                    model.layers[il].ffn_up,   NULL, NULL,
                    model.layers[il].ffn_gate, NULL, NULL,
                    model.layers[il].ffn_down, NULL, NULL,
                    NULL,
                    LLM_FFN_SILU, LLM_FFN_PAR, il);
            cb(cur, "ffn_out", il);

            if (hparams.swin_norm) {
                cur = build_norm(cur,
                        model.layers[il].ffn_norm, NULL,
                        LLM_NORM_RMS, il);
                cb(cur, "ffn_norm", il);
            }

            cur = ggml_add(ctx0, cur, ffn_inp);
            cb(cur, "ffn_out", il);

            cur = build_cvec(cur, il);
            cb(cur, "l_out", il);

            // input for next layer
            inpL = cur;
        }

        cur = inpL;

        cur = build_norm(cur,
                model.output_norm, NULL,
                LLM_NORM_RMS, -1);

        cb(cur, "result_norm", -1);
        res->t_embd = cur;

        // lm_head
        cur = build_lora_mm(model.output, cur);
        cb(cur, "result_output_with_img_logits", -1);

        // TODO: this suppresses the output of image tokens, which is required to enable text-only outputs.
        // Needs to be removed once image outputs are supported.
        int img_token_end_idx = 8196;
        int img_token_start_idx = 4;
        int num_img_tokens = img_token_end_idx - img_token_start_idx;
        // creates 1d tensor of size num_img_tokens and values -FLT_MAX,
        // which ensures that text token values are always at least larger than image token values
        ggml_tensor * img_logits = ggml_new_tensor_1d(ctx0, GGML_TYPE_F32, num_img_tokens);
        img_logits = ggml_clamp(ctx0, img_logits, -FLT_MAX, -FLT_MAX);
        cb(img_logits, "img_logits", -1);

        cur = ggml_set_1d(ctx0, cur, img_logits, ggml_element_size(cur) * img_token_start_idx);

        cb(cur, "result_output", -1);
        res->t_logits = cur;

        ggml_build_forward_expand(gf, cur);
    }